

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O3

_Bool trans_FSQRT(DisasContext_conflict1 *s,arg_rpr_esz *a)

{
  int iVar1;
  
  iVar1 = a->esz;
  if ((long)iVar1 != 0) {
    do_zpz_ptr(s,a->rd,a->rn,a->pg,iVar1 == 1,*(undefined1 **)(&DAT_010647d8 + (long)iVar1 * 8));
  }
  return iVar1 != 0;
}

Assistant:

static bool trans_FSQRT(DisasContext *s, arg_rpr_esz *a)
{
    static gen_helper_gvec_3_ptr * const fns[3] = {
        gen_helper_sve_fsqrt_h,
        gen_helper_sve_fsqrt_s,
        gen_helper_sve_fsqrt_d
    };
    if (a->esz == 0) {
        return false;
    }
    return do_zpz_ptr(s, a->rd, a->rn, a->pg, a->esz == MO_16, fns[a->esz - 1]);
}